

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::BeginFunction(TypeChecker *this,TypeVector *sig)

{
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_38;
  TypeVector *local_20;
  TypeVector *sig_local;
  TypeChecker *this_local;
  
  local_20 = sig;
  sig_local = (TypeVector *)this;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::clear(&this->type_stack_);
  std::vector<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>::clear
            (&this->label_stack_);
  memset(&local_38,0,0x18);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_38);
  PushLabel(this,First,&local_38,local_20);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_38);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::BeginFunction(const TypeVector& sig) {
  type_stack_.clear();
  label_stack_.clear();
  PushLabel(LabelType::Func, TypeVector(), sig);
  return Result::Ok;
}